

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::HasImplibGNUtoMS(cmGeneratorTarget *this)

{
  bool bVar1;
  bool local_4e;
  allocator local_39;
  string local_38;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *this_local;
  
  local_18 = this;
  bVar1 = HasImportLibrary(this);
  local_4e = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"GNUtoMS",&local_39);
    local_4e = GetPropertyAsBool(this,&local_38);
  }
  this_local._7_1_ = local_4e;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::HasImplibGNUtoMS() const
{
  return this->HasImportLibrary()
      && this->GetPropertyAsBool("GNUtoMS");
}